

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
::internal_upper_bound<std::__cxx11::string>
          (btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
  *this_00;
  bool bVar1;
  uint uVar2;
  btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
  *pbVar3;
  template_ElementType<3UL> *ppbVar4;
  undefined8 extraout_RDX;
  iterator iVar6;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  bVar5;
  
  pbVar3 = this;
  while( true ) {
    this_00 = *(btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
                **)pbVar3;
    uVar2 = btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
            ::upper_bound<std::__cxx11::string>(this_00,key,(key_compare *)this);
    bVar1 = btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
            ::leaf((btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                    *)this_00);
    if (bVar1) break;
    ppbVar4 = btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
              ::GetField<3ul>(this_00);
    pbVar3 = (btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
              *)(ppbVar4 + (int)uVar2);
  }
  bVar5.node = (btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                *)(ulong)uVar2;
  bVar5._8_8_ = extraout_RDX;
  bVar5 = internal_last<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>,std::pair<std::__cxx11::string_const,std::__cxx11::string>&,std::pair<std::__cxx11::string_const,std::__cxx11::string>*>>
                    ((btree<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
                      *)this_00,bVar5);
  iVar6.node = bVar5.node;
  iVar6.position = bVar5.position;
  iVar6._12_4_ = bVar5._12_4_;
  return iVar6;
}

Assistant:

auto btree<P>::internal_upper_bound(const K &key) const -> iterator {
        iterator iter(const_cast<node_type *>(root()), 0);
        for (;;) {
            iter.position = iter.node->upper_bound(key, key_comp());
            if (iter.node->leaf()) {
                break;
            }
            iter.node = iter.node->child(iter.position);
        }
        return internal_last(iter);
    }